

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Core.cpp
# Opt level: O3

bool __thiscall IRCCorePlugin::initialize(IRCCorePlugin *this)

{
  basic_string_view<char,_std::char_traits<char>_> *entry;
  pointer pbVar1;
  undefined1 auVar2 [16];
  container_type server_entries;
  container_type local_30;
  
  auVar2 = Jupiter::Config::get(&this->field_0x38,7,"Servers",0,0);
  if (auVar2._0_8_ != 0) {
    *(undefined1 **)(_serverManager + 0x20) = &this->field_0x38;
    jessilib::
    word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              (&local_30,auVar2._8_8_,auVar2._8_8_ + auVar2._0_8_," \t","");
    for (pbVar1 = local_30.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 != local_30.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      ServerManager::addServer(_serverManager,pbVar1->_M_len,pbVar1->_M_str);
    }
    if (local_30.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return true;
}

Assistant:

bool IRCCorePlugin::initialize() {
	// TODO: initialize() isn't bringing in generic commands from already-loaded plugins
	std::string_view serverList = this->config.get("Servers"sv);
	if (!serverList.empty()) {
		serverManager->setConfig(this->config);

		auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
		for (const auto& entry : server_entries) {
			serverManager->addServer(entry);
		}
	}

	return true;
}